

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.cc
# Opt level: O1

void __thiscall Pool::RetrieveReadyEdges(Pool *this,EdgeSet *ready_queue)

{
  int iVar1;
  int iVar2;
  Edge *in_RAX;
  const_iterator __last;
  Edge *edge;
  Edge *local_38;
  
  __last._M_node = (this->delayed_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_38 = in_RAX;
  do {
    if ((_Rb_tree_header *)__last._M_node == &(this->delayed_)._M_t._M_impl.super__Rb_tree_header)
    break;
    local_38 = *(Edge **)(__last._M_node + 1);
    iVar1 = this->current_use_;
    iVar2 = this->depth_;
    if (iVar1 < iVar2) {
      std::_Rb_tree<Edge*,Edge*,std::_Identity<Edge*>,EdgeCmp,std::allocator<Edge*>>::
      _M_insert_unique<Edge*const&>
                ((_Rb_tree<Edge*,Edge*,std::_Identity<Edge*>,EdgeCmp,std::allocator<Edge*>> *)
                 ready_queue,&local_38);
      if (this->depth_ != 0) {
        this->current_use_ = this->current_use_ + 1;
      }
      __last._M_node = (_Base_ptr)std::_Rb_tree_increment(__last._M_node);
    }
  } while (iVar1 < iVar2);
  std::
  _Rb_tree<Edge_*,_Edge_*,_std::_Identity<Edge_*>,_Pool::WeightedEdgeCmp,_std::allocator<Edge_*>_>::
  _M_erase_aux(&(this->delayed_)._M_t,
               (this->delayed_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left,__last);
  return;
}

Assistant:

void Pool::RetrieveReadyEdges(EdgeSet* ready_queue) {
  DelayedEdges::iterator it = delayed_.begin();
  while (it != delayed_.end()) {
    Edge* edge = *it;
    if (current_use_ + edge->weight() > depth_)
      break;
    ready_queue->insert(edge);
    EdgeScheduled(*edge);
    ++it;
  }
  delayed_.erase(delayed_.begin(), it);
}